

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_triangle_mesh.h
# Opt level: O1

PrimInfo * __thiscall
embree::avx::TriangleMeshISA::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,TriangleMeshISA *this,PrimRef *prims,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  undefined1 auVar1 [16];
  BufferView<embree::Vec3fa> *pBVar2;
  long lVar3;
  char *pcVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  bool bVar7;
  size_t sVar8;
  ulong uVar9;
  undefined4 uVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar20;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  undefined1 auVar23 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar24;
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar19 [64];
  undefined1 auVar21 [64];
  
  aVar18.m128[2] = INFINITY;
  aVar18._0_8_ = 0x7f8000007f800000;
  aVar18.m128[3] = INFINITY;
  auVar19 = ZEXT1664((undefined1  [16])aVar18);
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar18;
  aVar20.m128[2] = -INFINITY;
  aVar20._0_8_ = 0xff800000ff800000;
  aVar20.m128[3] = -INFINITY;
  auVar21 = ZEXT1664((undefined1  [16])aVar20);
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar20;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar18;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar20;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar13 = r->_begin;
  sVar8 = __return_storage_ptr__->end;
  aVar24 = aVar18;
  aVar22 = aVar20;
  if (uVar13 < r->_end) {
    auVar26._8_4_ = 0x7f800000;
    auVar26._0_8_ = 0x7f8000007f800000;
    auVar26._12_4_ = 0x7f800000;
    auVar27._8_4_ = 0xff800000;
    auVar27._0_8_ = 0xff800000ff800000;
    auVar27._12_4_ = 0xff800000;
    auVar28._8_4_ = 0xddccb9a2;
    auVar28._0_8_ = 0xddccb9a2ddccb9a2;
    auVar28._12_4_ = 0xddccb9a2;
    auVar29._8_4_ = 0x5dccb9a2;
    auVar29._0_8_ = 0x5dccb9a25dccb9a2;
    auVar29._12_4_ = 0x5dccb9a2;
    auVar25 = ZEXT1664((undefined1  [16])aVar18);
    auVar23 = ZEXT1664((undefined1  [16])aVar20);
    do {
      lVar14 = *(long *)&(this->super_TriangleMesh).super_Geometry.field_0x58;
      pBVar2 = (this->super_TriangleMesh).vertices.items;
      lVar16 = *(long *)&(this->super_TriangleMesh).field_0x68 * uVar13;
      uVar12 = (ulong)*(uint *)(lVar14 + lVar16);
      uVar17 = (pBVar2->super_RawBufferView).num;
      if (((uVar12 < uVar17) && (uVar9 = (ulong)*(uint *)(lVar14 + 4 + lVar16), uVar9 < uVar17)) &&
         (uVar15 = (ulong)*(uint *)(lVar14 + 8 + lVar16), uVar15 < uVar17)) {
        uVar17 = (ulong)(this->super_TriangleMesh).super_Geometry.numTimeSteps;
        if (uVar17 != 0) {
          lVar14 = 0;
          do {
            lVar16 = *(long *)((long)&(pBVar2->super_RawBufferView).ptr_ofs + lVar14);
            lVar3 = *(long *)((long)&(pBVar2->super_RawBufferView).stride + lVar14);
            auVar1 = *(undefined1 (*) [16])(lVar16 + lVar3 * uVar12);
            auVar30 = vcmpps_avx(auVar1,auVar28,6);
            auVar1 = vcmpps_avx(auVar1,auVar29,1);
            auVar1 = vandps_avx(auVar30,auVar1);
            uVar10 = vmovmskps_avx(auVar1);
            if ((~(byte)uVar10 & 7) != 0) goto LAB_012d0cdf;
            auVar1 = *(undefined1 (*) [16])(lVar16 + lVar3 * uVar9);
            auVar30 = vcmpps_avx(auVar1,auVar28,6);
            auVar1 = vcmpps_avx(auVar1,auVar29,1);
            auVar1 = vandps_avx(auVar30,auVar1);
            uVar10 = vmovmskps_avx(auVar1);
            if ((~(byte)uVar10 & 7) != 0) goto LAB_012d0cdf;
            auVar1 = *(undefined1 (*) [16])(lVar16 + lVar3 * uVar15);
            auVar30 = vcmpps_avx(auVar1,auVar28,6);
            auVar1 = vcmpps_avx(auVar1,auVar29,1);
            auVar1 = vandps_avx(auVar30,auVar1);
            uVar10 = vmovmskps_avx(auVar1);
            if ((~(byte)uVar10 & 7) != 0) goto LAB_012d0cdf;
            lVar14 = lVar14 + 0x38;
          } while (uVar17 * 0x38 - lVar14 != 0);
        }
        pcVar4 = (this->super_TriangleMesh).vertices0.super_RawBufferView.ptr_ofs;
        sVar11 = (this->super_TriangleMesh).vertices0.super_RawBufferView.stride;
        auVar1 = vminps_avx(*(undefined1 (*) [16])(pcVar4 + uVar12 * sVar11),
                            *(undefined1 (*) [16])(pcVar4 + uVar9 * sVar11));
        auVar30 = vminps_avx(auVar1,*(undefined1 (*) [16])(pcVar4 + uVar15 * sVar11));
        auVar1 = vmaxps_avx(*(undefined1 (*) [16])(pcVar4 + uVar12 * sVar11),
                            *(undefined1 (*) [16])(pcVar4 + uVar9 * sVar11));
        auVar1 = vmaxps_avx(auVar1,*(undefined1 (*) [16])(pcVar4 + uVar15 * sVar11));
        bVar7 = true;
      }
      else {
LAB_012d0cdf:
        bVar7 = false;
        auVar1 = auVar27;
        auVar30 = auVar26;
      }
      sVar11 = k;
      if (bVar7) {
        aVar5 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar30,ZEXT416(geomID),0x30);
        aVar6 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar1,ZEXT416((uint)uVar13),0x30);
        auVar1 = vminps_avx(auVar19._0_16_,(undefined1  [16])aVar5);
        auVar19 = ZEXT1664(auVar1);
        auVar1 = vmaxps_avx(auVar21._0_16_,(undefined1  [16])aVar6);
        auVar21 = ZEXT1664(auVar1);
        auVar30._0_4_ = aVar6.x + aVar5.x;
        auVar30._4_4_ = aVar6.y + aVar5.y;
        auVar30._8_4_ = aVar6.z + aVar5.z;
        auVar30._12_4_ = aVar6.field_3.w + aVar5.field_3.w;
        auVar1 = vminps_avx(auVar25._0_16_,auVar30);
        auVar25 = ZEXT1664(auVar1);
        auVar1 = vmaxps_avx(auVar23._0_16_,auVar30);
        auVar23 = ZEXT1664(auVar1);
        sVar8 = sVar8 + 1;
        sVar11 = k + 1;
        prims[k].lower.field_0.field_1 = aVar5;
        prims[k].upper.field_0.field_1 = aVar6;
      }
      aVar22 = auVar23._0_16_;
      aVar24 = auVar25._0_16_;
      aVar20 = auVar21._0_16_;
      aVar18 = auVar19._0_16_;
      uVar13 = uVar13 + 1;
      k = sVar11;
    } while (uVar13 < r->_end);
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar18;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar20;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar24;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar22;
  __return_storage_ptr__->end = sVar8;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          BBox3fa bounds = empty;
          if (!buildBounds(j,&bounds)) continue;
          const PrimRef prim(bounds,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }